

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O0

void __thiscall
wasm::InstrumentLocals::addImport
          (InstrumentLocals *this,Module *wasm,Name name,Type params,Type results)

{
  IString str;
  pointer pFVar1;
  Name name_00;
  Name local_b8 [2];
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_98;
  uintptr_t local_80;
  uintptr_t local_78;
  Signature local_70;
  HeapType local_60;
  char *local_58;
  HeapType HStack_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  Module *wasm_local;
  InstrumentLocals *this_local;
  Type results_local;
  Type params_local;
  Name name_local;
  
  HStack_50.id = name.super_IString.str._M_str;
  local_58 = name.super_IString.str._M_len;
  local_80 = results.id;
  local_78 = params.id;
  import._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
       (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)wasm;
  params_local.id = (uintptr_t)local_58;
  Signature::Signature(&local_70,params,results);
  HeapType::HeapType(&local_60,local_70);
  local_98.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_98);
  name_00.super_IString.str._M_str = local_58;
  name_00.super_IString.str._M_len = (size_t)&local_40;
  Builder::makeFunction
            (name_00,HStack_50,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_60.id,
             (Expression *)&local_98);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_98);
  str.str._M_str = (char *)ENV._8_8_;
  str.str._M_len = ENV._0_8_;
  wasm::Name::Name(local_b8,str);
  pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_40);
  wasm::Name::operator=(&(pFVar1->super_Importable).module,local_b8);
  pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_40);
  wasm::Name::operator=(&(pFVar1->super_Importable).base,(Name *)&params_local);
  Module::addFunction((Module *)
                      import._M_t.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,&local_40);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_40);
  return;
}

Assistant:

void addImport(Module* wasm, Name name, Type params, Type results) {
    auto import = Builder::makeFunction(name, Signature(params, results), {});
    import->module = ENV;
    import->base = name;
    wasm->addFunction(std::move(import));
  }